

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O0

void __thiscall CGameControllerCTF::Tick(CGameControllerCTF *this)

{
  CFlag *this_00;
  vec2 Pos0;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CGameContext *pCVar8;
  CCharacter *pCVar9;
  CPlayer *pCVar10;
  IServer *pIVar11;
  undefined4 extraout_var;
  IConsole *pIVar12;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 extraout_var_00;
  undefined4 extraout_var_01;
  IGameController *in_RDI;
  long in_FS_OFFSET;
  float fVar13;
  CCharacter *pChr;
  int i_1;
  int Num;
  int i;
  float Diff;
  CFlag *F;
  int fi;
  char aBuf_2 [256];
  char aBuf_1 [256];
  CCharacter *apCloseCCharacters [64];
  char aBuf [64];
  CCharacter *in_stack_fffffffffffffab8;
  CFlag *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad0;
  uint in_stack_fffffffffffffad4;
  vec2 *in_stack_fffffffffffffad8;
  CGameContext *in_stack_fffffffffffffae0;
  CGameWorld *in_stack_fffffffffffffae8;
  vec2 in_stack_fffffffffffffaf8;
  vec2 Pos1;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffffb18;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffffb1c;
  int local_480;
  uint local_46c;
  char local_448 [256];
  CGameWorld local_348;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  IGameController::Tick((IGameController *)in_stack_fffffffffffffae0);
  pCVar8 = IGameController::GameServer(in_RDI);
  if ((((pCVar8->m_World).m_ResetRequested & 1U) == 0) &&
     (pCVar8 = IGameController::GameServer(in_RDI), ((pCVar8->m_World).m_Paused & 1U) == 0)) {
    for (local_46c = 0; (int)local_46c < 2; local_46c = local_46c + 1) {
      this_00 = *(CFlag **)(in_RDI[1].m_aTeamSize + (long)(int)local_46c * 2 + -8);
      if (this_00 != (CFlag *)0x0) {
        pCVar9 = CFlag::GetCarrier(this_00);
        if (pCVar9 == (CCharacter *)0x0) {
          pCVar8 = IGameController::GameServer(in_RDI);
          Pos1 = (vec2)&pCVar8->m_World;
          CEntity::GetPos(&this_00->super_CEntity);
          iVar2 = CGameWorld::FindEntities
                            (in_stack_fffffffffffffae8,in_stack_fffffffffffffaf8,
                             (float)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                             (CEntity **)in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,
                             in_stack_fffffffffffffad0);
          for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
            bVar1 = CCharacter::IsAlive((CCharacter *)
                                        local_348.m_Core.m_apCharacters[(long)iVar5 + 6]);
            if (bVar1) {
              pCVar10 = CCharacter::GetPlayer
                                  ((CCharacter *)local_348.m_Core.m_apCharacters[(long)iVar5 + 6]);
              iVar6 = CPlayer::GetTeam(pCVar10);
              if (iVar6 != -1) {
                pCVar8 = IGameController::GameServer(in_RDI);
                CGameContext::Collision(pCVar8);
                CEntity::GetPos(&this_00->super_CEntity);
                CEntity::GetPos((CEntity *)local_348.m_Core.m_apCharacters[(long)iVar5 + 6]);
                Pos0.field_1 = in_stack_fffffffffffffb1c;
                Pos0.field_0 = in_stack_fffffffffffffb18;
                iVar6 = CCollision::IntersectLine
                                  ((CCollision *)in_stack_fffffffffffffae0,Pos0,Pos1,
                                   in_stack_fffffffffffffad8,
                                   (vec2 *)CONCAT44(in_stack_fffffffffffffad4,
                                                    in_stack_fffffffffffffad0));
                if (iVar6 == 0) {
                  pCVar10 = CCharacter::GetPlayer
                                      ((CCharacter *)
                                       local_348.m_Core.m_apCharacters[(long)iVar5 + 6]);
                  iVar6 = CPlayer::GetTeam(pCVar10);
                  iVar7 = CFlag::GetTeam(this_00);
                  if (iVar6 != iVar7) {
                    bVar1 = CFlag::IsAtStand(this_00);
                    if (bVar1) {
                      in_RDI->m_aTeamscore[(int)(local_46c ^ 1)] =
                           in_RDI->m_aTeamscore[(int)(local_46c ^ 1)] + 1;
                    }
                    CFlag::Grab(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
                    pCVar9 = CFlag::GetCarrier(this_00);
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    pCVar10->m_Score = pCVar10->m_Score + 1;
                    in_stack_fffffffffffffac8 = local_448;
                    pCVar9 = CFlag::GetCarrier(this_00);
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    in_stack_fffffffffffffad4 = CPlayer::GetCID(pCVar10);
                    in_stack_fffffffffffffac0 = (CFlag *)IGameController::Server(in_RDI);
                    pCVar9 = CFlag::GetCarrier(this_00);
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    uVar3 = CPlayer::GetCID(pCVar10);
                    iVar2 = (*(in_stack_fffffffffffffac0->super_CEntity)._vptr_CEntity[2])
                                      (in_stack_fffffffffffffac0,(ulong)uVar3);
                    in_stack_fffffffffffffad8 = (vec2 *)CONCAT44(extraout_var_01,iVar2);
                    pCVar9 = CFlag::GetCarrier(this_00);
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    uVar3 = CPlayer::GetTeam(pCVar10);
                    str_format(in_stack_fffffffffffffac8,0x100,"flag_grab player=\'%d:%s\' team=%d",
                               (ulong)in_stack_fffffffffffffad4,in_stack_fffffffffffffad8,
                               (ulong)uVar3);
                    pCVar8 = IGameController::GameServer(in_RDI);
                    pIVar12 = CGameContext::Console(pCVar8);
                    (*(pIVar12->super_IInterface)._vptr_IInterface[0x19])
                              (pIVar12,2,"game",local_448,0);
                    IGameController::GameServer(in_RDI);
                    CGameContext::SendGameMsg
                              ((CGameContext *)
                               CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                               (int)in_stack_fffffffffffffac8,
                               (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
                    break;
                  }
                  bVar1 = CFlag::IsAtStand(this_00);
                  if (!bVar1) {
                    pCVar9 = (CCharacter *)local_348.m_Core.m_apCharacters[(long)iVar5 + 6];
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    pCVar10->m_Score = pCVar10->m_Score + 1;
                    in_stack_fffffffffffffae8 = &local_348;
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    uVar3 = CPlayer::GetCID(pCVar10);
                    in_stack_fffffffffffffae0 = (CGameContext *)IGameController::Server(in_RDI);
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    uVar4 = CPlayer::GetCID(pCVar10);
                    in_stack_fffffffffffffaf8.field_0 =
                         (anon_union_4_2_94730284_for_vector2_base<float>_1)
                         (*(in_stack_fffffffffffffae0->super_IGameServer).super_IInterface.
                           _vptr_IInterface[2])(in_stack_fffffffffffffae0,(ulong)uVar4);
                    in_stack_fffffffffffffaf8.field_1.y = extraout_var_00.y;
                    pCVar10 = CCharacter::GetPlayer(pCVar9);
                    uVar4 = CPlayer::GetTeam(pCVar10);
                    str_format((char *)in_stack_fffffffffffffae8,0x100,
                               "flag_return player=\'%d:%s\' team=%d",(ulong)uVar3,
                               in_stack_fffffffffffffaf8,(ulong)uVar4);
                    pCVar8 = IGameController::GameServer(in_RDI);
                    pIVar12 = CGameContext::Console(pCVar8);
                    (*(pIVar12->super_IInterface)._vptr_IInterface[0x19])
                              (pIVar12,2,"game",&local_348,0);
                    IGameController::GameServer(in_RDI);
                    CGameContext::SendGameMsg
                              ((CGameContext *)
                               CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                               (int)in_stack_fffffffffffffac8);
                    (*(this_00->super_CEntity)._vptr_CEntity[3])();
                  }
                }
              }
            }
          }
        }
        else if ((*(long *)(in_RDI[1].m_aTeamSize + (long)(int)(local_46c ^ 1) * 2 + -8) != 0) &&
                (bVar1 = CFlag::IsAtStand(*(CFlag **)
                                           (in_RDI[1].m_aTeamSize +
                                           (long)(int)(local_46c ^ 1) * 2 + -8)), bVar1)) {
          CEntity::GetPos(&this_00->super_CEntity);
          CEntity::GetPos(*(CEntity **)(in_RDI[1].m_aTeamSize + (long)(int)(local_46c ^ 1) * 2 + -8)
                         );
          fVar13 = distance<float>((vector2_base<float> *)in_stack_fffffffffffffac0,
                                   (vector2_base<float> *)in_stack_fffffffffffffab8);
          if (fVar13 < 42.0) {
            in_RDI->m_aTeamscore[(int)(local_46c ^ 1)] =
                 in_RDI->m_aTeamscore[(int)(local_46c ^ 1)] + 100;
            pCVar9 = CFlag::GetCarrier(this_00);
            pCVar10 = CCharacter::GetPlayer(pCVar9);
            pCVar10->m_Score = pCVar10->m_Score + 5;
            pIVar11 = IGameController::Server(in_RDI);
            in_stack_fffffffffffffb1c =
                 (anon_union_4_2_947302a4_for_vector2_base<float>_3)IServer::Tick(pIVar11);
            iVar2 = CFlag::GetGrabTick(this_00);
            iVar2 = (int)in_stack_fffffffffffffb1c - iVar2;
            pCVar9 = CFlag::GetCarrier(this_00);
            pCVar10 = CCharacter::GetPlayer(pCVar9);
            uVar3 = CPlayer::GetCID(pCVar10);
            pIVar11 = IGameController::Server(in_RDI);
            pCVar9 = CFlag::GetCarrier(this_00);
            pCVar10 = CCharacter::GetPlayer(pCVar9);
            uVar4 = CPlayer::GetCID(pCVar10);
            iVar5 = (*(pIVar11->super_IInterface)._vptr_IInterface[2])(pIVar11,(ulong)uVar4);
            pCVar9 = CFlag::GetCarrier(this_00);
            pCVar10 = CCharacter::GetPlayer(pCVar9);
            uVar4 = CPlayer::GetTeam(pCVar10);
            pIVar11 = IGameController::Server(in_RDI);
            iVar6 = IServer::TickSpeed(pIVar11);
            str_format((char *)(double)((float)iVar2 / (float)iVar6),(int)local_48,(char *)0x40,
                       "flag_capture player=\'%d:%s\' team=%d time=%.2f",(ulong)uVar3,
                       CONCAT44(extraout_var,iVar5),(ulong)uVar4);
            pCVar8 = IGameController::GameServer(in_RDI);
            pIVar12 = CGameContext::Console(pCVar8);
            (*(pIVar12->super_IInterface)._vptr_IInterface[0x19])(pIVar12,2,"game",local_48,0);
            IGameController::GameServer(in_RDI);
            pCVar9 = CFlag::GetCarrier(this_00);
            pCVar10 = CCharacter::GetPlayer(pCVar9);
            CPlayer::GetCID(pCVar10);
            CGameContext::SendGameMsg
                      (in_stack_fffffffffffffae0,(int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                       (int)in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,
                       in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
            for (local_480 = 0; local_480 < 2; local_480 = local_480 + 1) {
              (**(code **)(**(long **)(in_RDI[1].m_aTeamSize + (long)local_480 * 2 + -8) + 0x18))();
            }
            uVar3 = (*in_RDI->_vptr_IGameController[1])();
            if ((uVar3 & 1) != 0) goto LAB_0012dcc8;
          }
        }
      }
    }
    (*in_RDI->_vptr_IGameController[1])();
  }
LAB_0012dcc8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameControllerCTF::Tick()
{
	IGameController::Tick();

	if(GameServer()->m_World.m_ResetRequested || GameServer()->m_World.m_Paused)
		return;

	for(int fi = 0; fi < 2; fi++)
	{
		CFlag *F = m_apFlags[fi];

		if(!F)
			continue;

		//
		if(F->GetCarrier())
		{
			if(m_apFlags[fi^1] && m_apFlags[fi^1]->IsAtStand())
			{
				if(distance(F->GetPos(), m_apFlags[fi^1]->GetPos()) < CFlag::ms_PhysSize + CCharacter::ms_PhysSize)
				{
					// CAPTURE! \o/
					m_aTeamscore[fi^1] += 100;
					F->GetCarrier()->GetPlayer()->m_Score += 5;
					float Diff = Server()->Tick() - F->GetGrabTick();

					char aBuf[64];
					str_format(aBuf, sizeof(aBuf), "flag_capture player='%d:%s' team=%d time=%.2f",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam(),
						Diff / (float)Server()->TickSpeed()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);

					GameServer()->SendGameMsg(GAMEMSG_CTF_CAPTURE, fi, F->GetCarrier()->GetPlayer()->GetCID(), Diff, -1);
					for(int i = 0; i < 2; i++)
						m_apFlags[i]->Reset();
					// do a win check(capture could trigger win condition)
					if(DoWincheckMatch())
						return;
				}
			}
		}
		else
		{
			CCharacter *apCloseCCharacters[MAX_CLIENTS];
			int Num = GameServer()->m_World.FindEntities(F->GetPos(), CFlag::ms_PhysSize, (CEntity**)apCloseCCharacters, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
			for(int i = 0; i < Num; i++)
			{
				if(!apCloseCCharacters[i]->IsAlive() || apCloseCCharacters[i]->GetPlayer()->GetTeam() == TEAM_SPECTATORS || GameServer()->Collision()->IntersectLine(F->GetPos(), apCloseCCharacters[i]->GetPos(), NULL, NULL))
					continue;

				if(apCloseCCharacters[i]->GetPlayer()->GetTeam() == F->GetTeam())
				{
					// return the flag
					if(!F->IsAtStand())
					{
						CCharacter *pChr = apCloseCCharacters[i];
						pChr->GetPlayer()->m_Score += 1;

						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "flag_return player='%d:%s' team=%d",
							pChr->GetPlayer()->GetCID(),
							Server()->ClientName(pChr->GetPlayer()->GetCID()),
							pChr->GetPlayer()->GetTeam()
						);
						GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
						GameServer()->SendGameMsg(GAMEMSG_CTF_RETURN, -1);
						F->Reset();
					}
				}
				else
				{
					// take the flag
					if(F->IsAtStand())
						m_aTeamscore[fi^1]++;

					F->Grab(apCloseCCharacters[i]);

					F->GetCarrier()->GetPlayer()->m_Score += 1;

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "flag_grab player='%d:%s' team=%d",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
					GameServer()->SendGameMsg(GAMEMSG_CTF_GRAB, fi, -1);
					break;
				}
			}
		}
	}
	// do a win check(grabbing flags could trigger win condition)
	DoWincheckMatch();
}